

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  Value *in_RSI;
  Value *in_RDI;
  
  swap(in_RSI,in_RDI);
  return in_RDI;
}

Assistant:

Value& Value::operator=(Value other) {
  swap(other);
  return *this;
}